

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O1

int cgltf_parse_json_texture_view
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_texture_view *out_texture_view)

{
  uint uVar1;
  jsmntok_t *pjVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  cgltf_extension *__s;
  long lVar9;
  cgltf_texture_transform *out_array;
  int iVar10;
  cgltf_size cVar11;
  uint i_00;
  cgltf_float cVar12;
  uint local_5c;
  
  if (tokens[(uint)i].type != JSMN_OBJECT) {
    return -1;
  }
  out_texture_view->scale = 1.0;
  lVar9 = 8;
  do {
    (out_texture_view->transform).offset[lVar9 + -5] = 1.0;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 10);
  iVar3 = tokens[(uint)i].size;
  i_00 = i + 1;
  if (0 < iVar3) {
    iVar10 = 0;
    while ((tokens[i_00].type == JSMN_STRING && (pjVar2 = tokens + i_00, pjVar2->size != 0))) {
      iVar5 = cgltf_json_strcmp(pjVar2,json_chunk,"index");
      if (iVar5 == 0) {
        iVar5 = cgltf_json_to_int(tokens + (long)(int)i_00 + 1,json_chunk);
        out_texture_view->texture = (cgltf_texture *)((long)iVar5 + 1);
LAB_001186b9:
        i_00 = i_00 + 2;
      }
      else {
        iVar5 = cgltf_json_strcmp(pjVar2,json_chunk,"texCoord");
        if (iVar5 == 0) {
          iVar5 = cgltf_json_to_int(tokens + (long)(int)i_00 + 1,json_chunk);
          out_texture_view->texcoord = iVar5;
          goto LAB_001186b9;
        }
        iVar5 = cgltf_json_strcmp(pjVar2,json_chunk,"scale");
        if ((iVar5 == 0) || (iVar5 = cgltf_json_strcmp(pjVar2,json_chunk,"strength"), iVar5 == 0)) {
          cVar12 = cgltf_json_to_float(tokens + (long)(int)i_00 + 1,json_chunk);
          out_texture_view->scale = cVar12;
          goto LAB_001186b9;
        }
        iVar5 = cgltf_json_strcmp(pjVar2,json_chunk,"extras");
        if (iVar5 == 0) {
          (out_texture_view->extras).start_offset = (long)tokens[i_00 + 1].start;
          (out_texture_view->extras).end_offset = (long)tokens[i_00 + 1].end;
LAB_00118700:
          i_00 = cgltf_skip_json(tokens,i_00 + 1);
        }
        else {
          iVar5 = cgltf_json_strcmp(pjVar2,json_chunk,"extensions");
          uVar1 = i_00 + 1;
          if (iVar5 != 0) goto LAB_00118700;
          if ((tokens[uVar1].type != JSMN_OBJECT) ||
             (out_texture_view->extensions != (cgltf_extension *)0x0)) break;
          iVar5 = tokens[uVar1].size;
          out_texture_view->extensions_count = 0;
          if ((long)iVar5 < 0) {
            __s = (cgltf_extension *)0x0;
          }
          else {
            cVar11 = (long)iVar5 << 4;
            __s = (cgltf_extension *)(*(options->memory).alloc)((options->memory).user_data,cVar11);
            if (__s == (cgltf_extension *)0x0) {
              __s = (cgltf_extension *)0x0;
            }
            else {
              memset(__s,0,cVar11);
            }
          }
          out_texture_view->extensions = __s;
          if (__s == (cgltf_extension *)0x0) {
            local_5c = 0xfffffffe;
            bVar4 = false;
            i_00 = uVar1;
          }
          else {
            i_00 = i_00 + 2;
            bVar4 = iVar5 < 1;
            if (0 < iVar5) {
              iVar8 = 0;
              do {
                if ((tokens[i_00].type != JSMN_STRING) || (tokens[i_00].size == 0)) {
                  bVar4 = false;
                  local_5c = 0xffffffff;
                  goto LAB_001189b2;
                }
                iVar6 = cgltf_json_strcmp(tokens + i_00,json_chunk,"KHR_texture_transform");
                if (iVar6 == 0) {
                  out_texture_view->has_transform = 1;
                  if (tokens[(long)(int)i_00 + 1].type == JSMN_OBJECT) {
                    iVar6 = tokens[(long)(int)i_00 + 1].size;
                    i_00 = i_00 + 2;
                    if (0 < iVar6) {
                      while( true ) {
                        iVar6 = iVar6 + -1;
                        if (tokens[i_00].type != JSMN_STRING) goto LAB_0011895c;
                        pjVar2 = tokens + i_00;
                        if (pjVar2->size == 0) break;
                        iVar7 = cgltf_json_strcmp(pjVar2,json_chunk,"offset");
                        out_array = &out_texture_view->transform;
                        if (iVar7 == 0) {
LAB_0011890f:
                          i_00 = cgltf_parse_json_float_array
                                           (tokens,i_00 + 1,json_chunk,out_array->offset,2);
                        }
                        else {
                          iVar7 = cgltf_json_strcmp(pjVar2,json_chunk,"rotation");
                          if (iVar7 == 0) {
                            cVar12 = cgltf_json_to_float(tokens + (long)(int)i_00 + 1,json_chunk);
                            (out_texture_view->transform).rotation = cVar12;
LAB_0011893a:
                            i_00 = i_00 + 2;
                          }
                          else {
                            iVar7 = cgltf_json_strcmp(pjVar2,json_chunk,"scale");
                            out_array = (cgltf_texture_transform *)
                                        (out_texture_view->transform).scale;
                            if (iVar7 == 0) goto LAB_0011890f;
                            iVar7 = cgltf_json_strcmp(pjVar2,json_chunk,"texCoord");
                            if (iVar7 == 0) {
                              iVar7 = cgltf_json_to_int(tokens + (long)(int)i_00 + 1,json_chunk);
                              (out_texture_view->transform).texcoord = iVar7;
                              goto LAB_0011893a;
                            }
                            i_00 = cgltf_skip_json(tokens,i_00 + 1);
                          }
                        }
                        if (((int)i_00 < 0) || (iVar6 == 0)) goto LAB_00118962;
                      }
                      i_00 = 0xffffffff;
                    }
                  }
                  else {
LAB_0011895c:
                    i_00 = 0xffffffff;
                  }
                }
                else {
                  cVar11 = out_texture_view->extensions_count;
                  out_texture_view->extensions_count = cVar11 + 1;
                  i_00 = cgltf_parse_json_unprocessed_extension
                                   (options,tokens,i_00,json_chunk,
                                    out_texture_view->extensions + cVar11);
                }
LAB_00118962:
                if ((int)i_00 < 0) {
                  bVar4 = false;
                  local_5c = i_00;
                  goto LAB_001189b2;
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 != iVar5);
              bVar4 = true;
            }
          }
LAB_001189b2:
          if (!bVar4) {
            return local_5c;
          }
        }
      }
      if ((int)i_00 < 0) {
        return i_00;
      }
      iVar10 = iVar10 + 1;
      if (iVar10 == iVar3) {
        return i_00;
      }
    }
    i_00 = 0xffffffff;
  }
  return i_00;
}

Assistant:

static int cgltf_parse_json_texture_view(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_texture_view* out_texture_view)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

	out_texture_view->scale = 1.0f;
	cgltf_fill_float_array(out_texture_view->transform.scale, 2, 1.0f);

	int size = tokens[i].size;
	++i;

	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		if (cgltf_json_strcmp(tokens + i, json_chunk, "index") == 0)
		{
			++i;
			out_texture_view->texture = CGLTF_PTRINDEX(cgltf_texture, cgltf_json_to_int(tokens + i, json_chunk));
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "texCoord") == 0)
		{
			++i;
			out_texture_view->texcoord = cgltf_json_to_int(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "scale") == 0) 
		{
			++i;
			out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "strength") == 0)
		{
			++i;
			out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "extras") == 0)
		{
			i = cgltf_parse_json_extras(tokens, i + 1, json_chunk, &out_texture_view->extras);
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "extensions") == 0)
		{
			++i;

			CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
			if(out_texture_view->extensions)
			{
				return CGLTF_ERROR_JSON;
			}

			int extensions_size = tokens[i].size;
			out_texture_view->extensions_count = 0;
			out_texture_view->extensions = (cgltf_extension*)cgltf_calloc(options, sizeof(cgltf_extension), extensions_size);

			if (!out_texture_view->extensions)
			{
				return CGLTF_ERROR_NOMEM;
			}

			++i;

			for (int k = 0; k < extensions_size; ++k)
			{
				CGLTF_CHECK_KEY(tokens[i]);

				if (cgltf_json_strcmp(tokens+i, json_chunk, "KHR_texture_transform") == 0)
				{
					out_texture_view->has_transform = 1;
					i = cgltf_parse_json_texture_transform(tokens, i + 1, json_chunk, &out_texture_view->transform);
				}
				else
				{
					i = cgltf_parse_json_unprocessed_extension(options, tokens, i, json_chunk, &(out_texture_view->extensions[out_texture_view->extensions_count++]));
				}

				if (i < 0)
				{
					return i;
				}
			}
		}
		else
		{
			i = cgltf_skip_json(tokens, i + 1);
		}

		if (i < 0)
		{
			return i;
		}
	}

	return i;
}